

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

upb_StringView
protobuf_test_messages_proto2_TestAllTypesProto2_optional_bytes
          (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  upb_StringView uVar1;
  bool bVar2;
  upb_StringView ret;
  upb_MiniTableField field;
  upb_StringView default_val;
  char *local_38;
  size_t local_30;
  upb_MiniTableField local_28;
  upb_StringView local_18;
  
  local_18 = upb_StringView_FromString("");
  local_28.number_dont_copy_me__upb_internal_use_only = 0xf;
  local_28.offset_dont_copy_me__upb_internal_use_only = 0xa8;
  local_28.presence = 0x4e;
  local_28.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_28.descriptortype_dont_copy_me__upb_internal_use_only = '\f';
  local_28.mode_dont_copy_me__upb_internal_use_only = 0x82;
  bVar2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_28,&local_18);
  if ((bVar2) ||
     (bVar2 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_28),
     bVar2)) {
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
              (&local_28,&local_38,
               (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                       ((ulong)local_28._0_8_ >> 0x20 & 0xffff)));
  }
  else {
    local_38 = local_18.data;
    local_30 = local_18.size;
  }
  uVar1.size = local_30;
  uVar1.data = local_38;
  return uVar1;
}

Assistant:

UPB_INLINE upb_StringView protobuf_test_messages_proto2_TestAllTypesProto2_optional_bytes(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  upb_StringView default_val = upb_StringView_FromString("");
  upb_StringView ret;
  const upb_MiniTableField field = {15, UPB_SIZE(464, 168), 78, kUpb_NoSub, 12, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_StringView << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}